

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_gfx_rotatef(float angleDeg,float x,float y,float z)

{
  rf_mat *prVar1;
  rf_mat left;
  rf_vec3 rVar2;
  rf_mat result;
  rf_mat local_90;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  undefined8 uStack_18;
  
  local_90.m9 = 0.0;
  local_90.m13 = 0.0;
  local_90.m2 = 0.0;
  local_90.m7 = 0.0;
  local_90.m11 = 0.0;
  local_90.m6 = 0.0;
  local_90.m14 = 0.0;
  local_90.m3 = 0.0;
  local_90.m4 = 0.0;
  local_90.m8 = 0.0;
  local_90.m12 = 0.0;
  local_90.m1 = 0.0;
  local_90.m0 = 1.0;
  local_90.m5 = 1.0;
  local_90.m10 = 1.0;
  local_90.m15 = 1.0;
  rVar2.y = y;
  rVar2.x = x;
  rVar2.z = z;
  rVar2 = rf_vec3_normalize(rVar2);
  rf_mat_rotate(&local_90,rVar2,angleDeg * 0.017453292);
  prVar1 = (rf__ctx->field_0).current_matrix;
  left.m4 = local_90.m4;
  left.m0 = local_90.m0;
  left.m12 = local_90.m12;
  left.m8 = local_90.m8;
  left.m5 = local_90.m5;
  left.m1 = local_90.m1;
  left.m13 = local_90.m13;
  left.m9 = local_90.m9;
  left.m6 = local_90.m6;
  left.m2 = local_90.m2;
  left.m14 = local_90.m14;
  left.m10 = local_90.m10;
  left.m7 = local_90.m7;
  left.m3 = local_90.m3;
  left.m15 = local_90.m15;
  left.m11 = local_90.m11;
  rf_mat_mul(left,*prVar1);
  prVar1->m3 = (float)(undefined4)local_20;
  prVar1->m7 = (float)local_20._4_4_;
  prVar1->m11 = (float)(undefined4)uStack_18;
  prVar1->m15 = (float)uStack_18._4_4_;
  prVar1->m2 = (float)(undefined4)local_30;
  prVar1->m6 = (float)local_30._4_4_;
  prVar1->m10 = (float)(undefined4)uStack_28;
  prVar1->m14 = (float)uStack_28._4_4_;
  prVar1->m1 = (float)(undefined4)local_40;
  prVar1->m5 = (float)local_40._4_4_;
  prVar1->m9 = (float)(undefined4)uStack_38;
  prVar1->m13 = (float)uStack_38._4_4_;
  prVar1->m0 = (float)(undefined4)local_50;
  prVar1->m4 = (float)local_50._4_4_;
  prVar1->m8 = (float)(undefined4)uStack_48;
  prVar1->m12 = (float)uStack_48._4_4_;
  return;
}

Assistant:

RF_API void rf_gfx_rotatef(float angleDeg, float x, float y, float z)
{
    rf_mat mat_rotation = rf_mat_identity();

    rf_vec3 axis = (rf_vec3){x, y, z };
    mat_rotation = rf_mat_rotate(rf_vec3_normalize(axis), angleDeg * RF_DEG2RAD);

    // NOTE: We transpose matrix with multiplication order
    *rf_ctx.current_matrix = rf_mat_mul(mat_rotation, *rf_ctx.current_matrix);
}